

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transport.cpp
# Opt level: O0

void __thiscall adios2::Transport::SetBuffer(Transport *this,char *param_2,size_t param_3)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  invalid_argument local_28 [40];
  
  __rhs = &local_e8;
  std::operator+(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::operator+(in_stack_ffffffffffffff08,(char *)__rhs);
  std::operator+(in_stack_ffffffffffffff08,__rhs);
  std::operator+(in_stack_ffffffffffffff08,(char *)__rhs);
  std::operator+(in_stack_ffffffffffffff08,__rhs);
  std::operator+(in_stack_ffffffffffffff08,(char *)__rhs);
  std::invalid_argument::invalid_argument(local_28,local_48);
  std::invalid_argument::~invalid_argument(local_28);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  return;
}

Assistant:

void Transport::SetBuffer(char * /*buffer*/, size_t /*size*/)
{
    std::invalid_argument("ERROR: " + m_Name + " transport type " + m_Type + " using library " +
                          m_Library + " doesn't implement the SetBuffer function\n");
}